

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pq_test.cpp
# Opt level: O2

void __thiscall priorityQueueTest_only_data_Test::TestBody(priorityQueueTest_only_data_Test *this)

{
  double dVar1;
  T *pTVar2;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  AssertHelper local_98;
  AssertionResult gtest_ar;
  priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_> std_pq;
  Priority_queue pq;
  
  std_pq.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std_pq.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  std_pq.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pq.PriQueue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0;
  pq._20_8_ = 0;
  pq.PriQueue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  pq.PriQueue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_4_ = 0;
  pq.PriQueue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish._4_4_ = 0;
  iVar3 = 100000;
  while (bVar5 = iVar3 != 0, iVar3 = iVar3 + -1, bVar5) {
    gtest_ar.success_ = false;
    gtest_ar._1_7_ = 0x3ff00000000000;
    std::priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>::
    push(&std_pq,(value_type *)&gtest_ar);
    gtest_ar.success_ = false;
    gtest_ar._1_7_ = 0x3ff00000000000;
    Priority_queue::push(&pq,(T *)&gtest_ar);
  }
  dVar1 = *std_pq.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar2 = Priority_queue::top(&pq);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"std_pq.top()","pq.top()",dVar1,*pTVar2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zxc479773533[P]uniquelab-2017-summer-assignment-1/pq_test.cpp"
               ,0x40,pcVar4);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_a0.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)std_pq.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)std_pq.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3);
    local_98.data_ = (AssertHelperData *)Priority_queue::size(&pq);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar,"std_pq.size()","pq.size()",(unsigned_long *)&local_a0,
               (unsigned_long *)&local_98);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_a0);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/zxc479773533[P]uniquelab-2017-summer-assignment-1/pq_test.cpp"
                 ,0x41,pcVar4);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      while (bVar5 = Priority_queue::empty(&pq), !bVar5) {
        dVar1 = *std_pq.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pTVar2 = Priority_queue::top(&pq);
        testing::internal::CmpHelperFloatingPointEQ<double>
                  ((internal *)&gtest_ar,"std_pq.top()","pq.top()",dVar1,*pTVar2);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_a0);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_98,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/zxc479773533[P]uniquelab-2017-summer-assignment-1/pq_test.cpp"
                     ,0x43,pcVar4);
          testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
          testing::internal::AssertHelper::~AssertHelper(&local_98);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&local_a0);
          goto LAB_00124bc6;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        std::
        priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>::
        pop(&std_pq);
        Priority_queue::pop(&pq);
      }
      local_a0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           Priority_queue::size(&pq);
      local_98.data_ = local_98.data_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<unsigned_long,int>
                ((internal *)&gtest_ar,"pq.size()","0",(unsigned_long *)&local_a0,(int *)&local_98);
      if (gtest_ar.success_ != false) {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        local_a0.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)std_pq.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)std_pq.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3);
        local_98.data_ = local_98.data_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<unsigned_long,int>
                  ((internal *)&gtest_ar,"std_pq.size()","0",(unsigned_long *)&local_a0,
                   (int *)&local_98);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_a0);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_98,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/zxc479773533[P]uniquelab-2017-summer-assignment-1/pq_test.cpp"
                     ,0x48,pcVar4);
          testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
          testing::internal::AssertHelper::~AssertHelper(&local_98);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&local_a0);
        }
        goto LAB_00124bc6;
      }
      testing::Message::Message((Message *)&local_a0);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/zxc479773533[P]uniquelab-2017-summer-assignment-1/pq_test.cpp"
                 ,0x47,pcVar4);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_98);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_a0);
LAB_00124bc6:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  Priority_queue::~Priority_queue(&pq);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&std_pq);
  return;
}

Assistant:

TEST_F(priorityQueueTest, only_data) {
    std::priority_queue<double> std_pq;
    Priority_queue pq;
    for (unsigned int i = 0; i != 100000; ++i) {
        std_pq.push((double) 1);
        pq.push((double) 1);
    }
    ASSERT_DOUBLE_EQ(std_pq.top(), pq.top());
    ASSERT_EQ(std_pq.size(), pq.size());
    while (!pq.empty()) {
        ASSERT_DOUBLE_EQ(std_pq.top(), pq.top());
        std_pq.pop();
        pq.pop();
    }
    ASSERT_EQ(pq.size(), 0);
    ASSERT_EQ(std_pq.size(), 0);

}